

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O0

void __thiscall
cppcms::forwarder::add_forwarding_rule
          (forwarder *this,shared_ptr<cppcms::mount_point> *p,string *ip,int port)

{
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *in_RDI
  ;
  unique_lock<booster::shared_mutex> lock;
  type in_stack_ffffffffffffff78;
  unique_lock<booster::shared_mutex> *in_stack_ffffffffffffff80;
  key_type *in_stack_ffffffffffffffb8;
  map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  std::unique_lock<booster::shared_mutex>::unique_lock
            (in_stack_ffffffffffffff80,(mutex_type *)in_stack_ffffffffffffff78);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<int_&,_true>(in_RDI,in_RSI,(int *)in_stack_ffffffffffffff80);
  this_00 = std::
            map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  operator=(this_00,in_stack_ffffffffffffff78);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x42baf2);
  std::unique_lock<booster::shared_mutex>::~unique_lock
            ((unique_lock<booster::shared_mutex> *)this_00);
  return;
}

Assistant:

void forwarder::add_forwarding_rule(booster::shared_ptr<mount_point> p,std::string const &ip,int port)
	{
		booster::unique_lock<booster::shared_mutex> lock(mutex_);
		rules_[p]=address_type(ip,port);
	}